

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib.c
# Opt level: O3

void WjTestLib_NewGroup(char *GroupName)

{
  WJTL_STATUS WVar1;
  WjtlGroupList *pWVar2;
  char *pcVar3;
  WjtlTestList *pWVar4;
  WjtlGroupList **ppWVar5;
  WjtlTestList *pWVar6;
  WjtlGroupList *unaff_RBX;
  char *pcVar7;
  long lVar8;
  WjtlGroupList *pWVar9;
  WjtlGroupList *unaff_R12;
  bool bVar10;
  uint64_t uStack_b0;
  uint64_t uStack_a8;
  uint64_t uStack_a0;
  uint64_t uStack_98;
  uint64_t uStack_90;
  uint64_t auStack_88 [3];
  WjtlGroupList *pWStack_70;
  WjtlGroupList *pWStack_68;
  
  pWVar9 = (WjtlGroupList *)0x1;
  pcVar7 = (char *)0x28;
  pWVar2 = (WjtlGroupList *)calloc(1,0x28);
  if (pWVar2 == (WjtlGroupList *)0x0) {
    WjTestLib_NewGroup_cold_2();
  }
  else {
    pcVar3 = strdup(GroupName);
    pWVar2->GroupName = pcVar3;
    unaff_RBX = pWVar2;
    pWVar9 = (WjtlGroupList *)GroupName;
    if (pcVar3 != (char *)0x0) {
      ppWVar5 = &gGroupListHead;
      if (gGroupListTail != (WjtlGroupList *)0x0) {
        ppWVar5 = &gGroupListTail->Next;
      }
      ((WjtlGroupList *)ppWVar5)->Next = pWVar2;
      gGroupListTail = pWVar2;
      return;
    }
  }
  WjTestLib_NewGroup_cold_1();
  if ((pWVar9 == (WjtlGroupList *)0x0) || (pcVar7 == (char *)0x0)) {
    WjTestLib_AddTest_cold_1();
LAB_0011dbb2:
    WjTestLib_AddTest_cold_3();
  }
  else {
    unaff_RBX = pWVar9;
    if ((gGroupListTail == (WjtlGroupList *)0x0) &&
       (WjTestLib_NewGroup("Default"), unaff_R12 = gGroupListTail,
       gGroupListTail == (WjtlGroupList *)0x0)) goto LAB_0011dbbc;
    unaff_R12 = gGroupListTail;
    pWVar4 = (WjtlTestList *)calloc(1,0x50);
    if (pWVar4 == (WjtlTestList *)0x0) goto LAB_0011dbb2;
    pcVar7 = strdup(pcVar7);
    pWVar4->TestName = pcVar7;
    if (pcVar7 != (char *)0x0) {
      pWVar4->TestFunction = (WJTL_UNIT_TEST_FUNCTION)pWVar9;
      pWVar6 = (WjtlTestList *)&unaff_R12->TestListHead;
      if (unaff_R12->TestListTail != (WjtlTestList *)0x0) {
        pWVar6 = unaff_R12->TestListTail;
      }
      pWVar6->Next = pWVar4;
      unaff_R12->TestListTail = pWVar4;
      return;
    }
  }
  WjTestLib_AddTest_cold_2();
LAB_0011dbbc:
  WjTestLib_AddTest_cold_4();
  pWStack_70 = unaff_RBX;
  pWStack_68 = unaff_R12;
  if (gGroupListHead == (WjtlGroupList *)0x0) {
    pcVar7 = "No group named: %s\n";
LAB_0011dd2d:
    printf(pcVar7,0);
  }
  else {
    bVar10 = false;
    pWVar9 = gGroupListHead;
    do {
      while( true ) {
        printf(":::::::: Test Group : %s ::::::::\n",pWVar9->GroupName);
        pWVar4 = pWVar9->TestListHead;
        if (pWVar4 != (WjtlTestList *)0x0) break;
        pWVar9 = pWVar9->Next;
        if (pWVar9 == (WjtlGroupList *)0x0) {
          if (bVar10) {
            return;
          }
          pcVar7 = "No test named: %s\n";
          goto LAB_0011dd2d;
        }
      }
      do {
        printf(":::: Test : %s ::::\n",pWVar4->TestName);
        auStack_88[0] = 0;
        auStack_88[2] = 0;
        uStack_90 = 0;
        uStack_98 = 0;
        auStack_88[1] = 0;
        uStack_a0 = 0;
        uStack_a8 = 0;
        uStack_b0 = 0;
        WjTestLib_Memory_GetStats(auStack_88,auStack_88 + 2,&uStack_90);
        WjTestLib_Asserts_Reset();
        WVar1 = (*pWVar4->TestFunction)();
        WjTestLib_Memory_GetStats(&uStack_98,auStack_88 + 1,&uStack_a0);
        WjTestLib_Asserts_GetStats(&uStack_a8,&uStack_b0);
        pWVar4->TestStatus = WVar1;
        pWVar4->NumAsserts = uStack_a8;
        pWVar4->NumFailedAsserts = uStack_b0;
        if (uStack_b0 != 0) {
          printf("#### %lu Assert fails in test: %s\n",uStack_b0,pWVar4->TestName);
        }
        pWVar4->NumAllocations = uStack_98 - auStack_88[0];
        lVar8 = uStack_a0 - uStack_90;
        pWVar4->NumMemLeaks = lVar8;
        if (lVar8 != 0) {
          printf("#### %lu Memory leaks in test: %s\n",lVar8,pWVar4->TestName);
        }
        pWVar9->GroupRun = true;
        pWVar4->TestRun = true;
        pWVar4 = pWVar4->Next;
      } while (pWVar4 != (WjtlTestList *)0x0);
      pWVar9 = pWVar9->Next;
      bVar10 = true;
    } while (pWVar9 != (WjtlGroupList *)0x0);
  }
  return;
}

Assistant:

void
WjTestLib_NewGroup
    (
        char const*     GroupName
    )
{
    WjtlGroupList* newGroup = calloc( 1, sizeof(WjtlGroupList) );
    if( NULL != newGroup )
    {
        newGroup->GroupName = strdup( GroupName );
        if( NULL != newGroup->GroupName )
        {
            newGroup->Next = NULL;
            newGroup->TestListHead = NULL;
            newGroup->TestListTail = NULL;

            if( NULL != gGroupListTail )
            {
                gGroupListTail->Next = newGroup;
            }
            else
            {
                gGroupListHead = newGroup;
            }
            gGroupListTail = newGroup;
        }
        else
        {
            InternalError( "Memory Fail" );
        }
    }
    else
    {
        InternalError( "Memory Fail" );
    }
}